

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O2

int32_t nghttp2_session_get_stream_remote_window_size(nghttp2_session *session,int32_t stream_id)

{
  int iVar1;
  nghttp2_stream *pnVar2;
  
  pnVar2 = nghttp2_session_get_stream(session,stream_id);
  if (pnVar2 != (nghttp2_stream *)0x0) {
    iVar1 = 0;
    if (0 < pnVar2->remote_window_size) {
      iVar1 = pnVar2->remote_window_size;
    }
    return iVar1;
  }
  return -1;
}

Assistant:

int32_t nghttp2_session_get_stream_remote_window_size(nghttp2_session *session,
                                                      int32_t stream_id) {
  nghttp2_stream *stream;

  stream = nghttp2_session_get_stream(session, stream_id);
  if (stream == NULL) {
    return -1;
  }

  /* stream->remote_window_size can be negative when
     SETTINGS_INITIAL_WINDOW_SIZE is changed. */
  return nghttp2_max(0, stream->remote_window_size);
}